

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::Render(void)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ImVec2 IVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ImGuiViewportP *pIVar6;
  ImGuiWindow *window;
  ImDrawData *pIVar7;
  _func_void_ImDrawData_ptr *p_Var8;
  ImGuiContext *pIVar9;
  bool bVar10;
  undefined4 extraout_EAX;
  uint uVar11;
  ImDrawList *pIVar12;
  ImDrawList **ppIVar13;
  long lVar14;
  int n;
  ImGuiWindow *pIVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  ImGuiWindow *pIVar19;
  int iVar20;
  int iVar21;
  float fVar22;
  float fVar25;
  undefined1 auVar24 [16];
  ImGuiWindow *windows_to_render_top_most [2];
  ImVec2 uv [4];
  ImVec2 local_a8;
  float local_98;
  float fStack_94;
  float local_88;
  ImVec2 local_70;
  ImGuiWindow *local_68 [3];
  ImVec2 local_50;
  ImVec2 local_48;
  undefined8 uStack_40;
  ImVec2 local_38;
  undefined8 uStack_30;
  undefined1 auVar23 [16];
  
  pIVar9 = GImGui;
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    EndFrame();
  }
  pIVar9->FrameCountRendered = pIVar9->FrameCount;
  (pIVar9->IO).MetricsRenderWindows = 0;
  (pIVar9->IO).MetricsRenderVertices = 0;
  (pIVar9->IO).MetricsRenderIndices = 0;
  if ((pIVar9->Viewports).Size != 0) {
    uVar18 = 0;
    do {
      pIVar6 = (pIVar9->Viewports).Data[uVar18];
      ImDrawDataBuilder::Clear(&pIVar6->DrawDataBuilder);
      if (pIVar6->DrawLists[0] != (ImDrawList *)0x0) {
        pIVar12 = GetViewportDrawList(pIVar6,0,"##Background");
        AddDrawListToDrawData((pIVar6->DrawDataBuilder).Layers,pIVar12);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != (uint)(pIVar9->Viewports).Size);
  }
  pIVar19 = pIVar9->NavWindowingTarget;
  if ((pIVar19 == (ImGuiWindow *)0x0) || ((pIVar19->Flags & 0x2000) != 0)) {
    pIVar15 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar15 = pIVar19->RootWindow;
  }
  local_68[0] = pIVar15;
  if (pIVar19 == (ImGuiWindow *)0x0) {
    pIVar19 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar19 = pIVar9->NavWindowingList;
  }
  local_68[1] = pIVar19;
  if ((pIVar9->Windows).Size != 0) {
    uVar18 = 0;
    do {
      window = (pIVar9->Windows).Data[uVar18];
      if ((window->Active == true) && (window->Hidden == false)) {
        if ((window != pIVar19 && window != pIVar15) && (window->Flags & 0x1000000U) == 0) {
          AddWindowToDrawData(window,(uint)window->Flags >> 0x19 & 1);
        }
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != (uint)(pIVar9->Windows).Size);
  }
  lVar16 = 0;
  do {
    pIVar19 = local_68[lVar16];
    if (((pIVar19 != (ImGuiWindow *)0x0) && (pIVar19->Active == true)) && (pIVar19->Hidden == false)
       ) {
      AddWindowToDrawData(pIVar19,(uint)pIVar19->Flags >> 0x19 & 1);
    }
    lVar16 = lVar16 + 1;
  } while (lVar16 == 1);
  local_98 = 0.0;
  fStack_94 = 0.0;
  local_88 = 0.0;
  if ((pIVar9->IO).MouseDrawCursor == false) {
    local_a8.x = 0.0;
    local_a8.y = 0.0;
  }
  else {
    local_a8.x = 0.0;
    local_a8.y = 0.0;
    if (pIVar9->MouseCursor != -1) {
      local_50.x = 0.0;
      local_50.y = 0.0;
      local_70.x = 0.0;
      local_70.y = 0.0;
      local_38.x = 0.0;
      local_38.y = 0.0;
      uStack_30 = 0;
      local_98 = 0.0;
      fStack_94 = 0.0;
      local_48.x = 0.0;
      local_48.y = 0.0;
      uStack_40 = 0;
      bVar10 = ImFontAtlas::GetMouseCursorTexData
                         ((pIVar9->IO).Fonts,pIVar9->MouseCursor,&local_50,&local_70,&local_48,
                          &local_38);
      local_88 = 0.0;
      local_a8.x = 0.0;
      local_a8.y = 0.0;
      if (bVar10) {
        fVar22 = (pIVar9->Style).MouseCursorScale;
        local_a8 = (pIVar9->IO).MousePos;
        local_98 = fVar22 * (local_70.x + 2.0) + local_a8.x;
        local_88 = local_a8.y;
        fStack_94 = fVar22 * (local_70.y + 2.0) + local_88;
      }
    }
  }
  (pIVar9->IO).MetricsRenderVertices = 0;
  (pIVar9->IO).MetricsRenderIndices = 0;
  if (0 < (pIVar9->Viewports).Size) {
    lVar16 = 0;
    do {
      pIVar6 = (pIVar9->Viewports).Data[lVar16];
      ImDrawDataBuilder::FlattenIntoSingleLayer(&pIVar6->DrawDataBuilder);
      IVar3 = (pIVar6->super_ImGuiViewport).Pos;
      fVar22 = IVar3.x;
      fVar25 = IVar3.y;
      if (local_88 < fVar25 + (pIVar6->super_ImGuiViewport).Size.y) {
        iVar20 = -(uint)(fVar22 < local_98);
        iVar21 = -(uint)(fVar25 < fStack_94);
        auVar24._4_4_ = iVar21;
        auVar24._0_4_ = iVar20;
        auVar24._8_4_ = iVar21;
        auVar24._12_4_ = iVar21;
        auVar23._8_8_ = auVar24._8_8_;
        auVar23._4_4_ = iVar20;
        auVar23._0_4_ = iVar20;
        uVar11 = movmskpd(extraout_EAX,auVar23);
        if ((((byte)((byte)uVar11 >> 1) != 0) &&
            (local_a8.x < fVar22 + (pIVar6->super_ImGuiViewport).Size.x)) && ((uVar11 & 1) != 0)) {
          pIVar12 = GetViewportDrawList(pIVar6,1,"##Foreground");
          RenderMouseCursor(pIVar12,(pIVar9->IO).MousePos,(pIVar9->Style).MouseCursorScale,
                            pIVar9->MouseCursor,0xffffffff,0xff000000,0x30000000);
        }
      }
      if (pIVar6->DrawLists[1] != (ImDrawList *)0x0) {
        pIVar12 = GetViewportDrawList(pIVar6,1,"##Foreground");
        AddDrawListToDrawData((pIVar6->DrawDataBuilder).Layers,pIVar12);
      }
      (pIVar6->super_ImGuiViewport).DrawData = &pIVar6->DrawDataP;
      (pIVar6->DrawDataP).Valid = true;
      iVar20 = (pIVar6->DrawDataBuilder).Layers[0].Size;
      if ((long)iVar20 < 1) {
        ppIVar13 = (ImDrawList **)0x0;
      }
      else {
        ppIVar13 = (pIVar6->DrawDataBuilder).Layers[0].Data;
      }
      (pIVar6->DrawDataP).CmdLists = ppIVar13;
      (pIVar6->DrawDataP).CmdListsCount = iVar20;
      (pIVar6->DrawDataP).TotalIdxCount = 0;
      (pIVar6->DrawDataP).TotalVtxCount = 0;
      IVar3 = (pIVar6->super_ImGuiViewport).Size;
      (pIVar6->DrawDataP).DisplayPos = (pIVar6->super_ImGuiViewport).Pos;
      (pIVar6->DrawDataP).DisplaySize = IVar3;
      (pIVar6->DrawDataP).FramebufferScale = (GImGui->IO).DisplayFramebufferScale;
      (pIVar6->DrawDataP).OwnerViewport = &pIVar6->super_ImGuiViewport;
      if (0 < iVar20) {
        lVar14 = 0;
        iVar21 = 0;
        iVar17 = 0;
        do {
          pIVar12 = (pIVar6->DrawDataBuilder).Layers[0].Data[lVar14];
          iVar17 = iVar17 + (pIVar12->VtxBuffer).Size;
          iVar21 = iVar21 + (pIVar12->IdxBuffer).Size;
          lVar14 = lVar14 + 1;
        } while (iVar20 != lVar14);
        (pIVar6->DrawDataP).TotalVtxCount = iVar17;
        (pIVar6->DrawDataP).TotalIdxCount = iVar21;
      }
      pIVar7 = (pIVar6->super_ImGuiViewport).DrawData;
      uVar1 = pIVar7->TotalIdxCount;
      uVar4 = pIVar7->TotalVtxCount;
      uVar2 = (pIVar9->IO).MetricsRenderVertices;
      uVar5 = (pIVar9->IO).MetricsRenderIndices;
      (pIVar9->IO).MetricsRenderVertices = uVar2 + uVar4;
      (pIVar9->IO).MetricsRenderIndices = uVar5 + uVar1;
      lVar16 = lVar16 + 1;
    } while (lVar16 < (pIVar9->Viewports).Size);
  }
  pIVar7 = ((*(pIVar9->Viewports).Data)->super_ImGuiViewport).DrawData;
  if ((0 < pIVar7->CmdListsCount) &&
     (p_Var8 = (pIVar9->IO).RenderDrawListsFn, p_Var8 != (_func_void_ImDrawData_ptr *)0x0)) {
    (*p_Var8)(pIVar7);
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = g.IO.MetricsRenderWindows = 0;

    // Add background ImDrawList (for each active viewport)
    for (int n = 0; n != g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.Clear();
        if (viewport->DrawLists[0] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetBackgroundDrawList(viewport));
    }

    // Add ImDrawList to render (for each active window)
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingList : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the tp-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);

    // Draw software mouse cursor if requested
    ImRect mouse_cursor_rect;
    if (g.IO.MouseDrawCursor && g.MouseCursor != ImGuiMouseCursor_None)
    {
        ImVec2 offset, size, uv[4];
        if (g.IO.Fonts->GetMouseCursorTexData(g.MouseCursor, &offset, &size, &uv[0], &uv[2]))
            mouse_cursor_rect = ImRect(g.IO.MousePos, g.IO.MousePos + ImVec2(size.x + 2, size.y + 2) * g.Style.MouseCursorScale);
    }

    // Setup ImDrawData structures for end-user
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = 0;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.FlattenIntoSingleLayer();

        if (viewport->GetRect().Overlaps(mouse_cursor_rect))
            RenderMouseCursor(GetForegroundDrawList(viewport), g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

        // Add foreground ImDrawList (for each active viewport)
        if (viewport->DrawLists[1] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetForegroundDrawList(viewport));

        SetupViewportDrawData(viewport, &viewport->DrawDataBuilder.Layers[0]);
        g.IO.MetricsRenderVertices += viewport->DrawData->TotalVtxCount;
        g.IO.MetricsRenderIndices += viewport->DrawData->TotalIdxCount;
    }

    // (Legacy) Call the Render callback function. The current prefer way is to let the user retrieve GetDrawData() and call the render function themselves.
#ifndef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
    if (g.Viewports[0]->DrawData->CmdListsCount > 0 && g.IO.RenderDrawListsFn != NULL)
        g.IO.RenderDrawListsFn(g.Viewports[0]->DrawData);
#endif
}